

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

int stbtt_PackFontRangesRenderIntoRects
              (stbtt_pack_context *spc,stbtt_fontinfo *info,stbtt_pack_range *ranges,int num_ranges,
              stbrp_rect *rects)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  short sVar6;
  int iVar7;
  short sVar8;
  stbrp_rect *r;
  stbrp_rect *psVar9;
  uint uVar10;
  int iVar11;
  stbtt_pack_range *psVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  int y0;
  int x0;
  int advance;
  int y1;
  int x1;
  int lsb;
  int local_bc;
  float local_b8;
  float local_b4;
  int local_94;
  int local_90;
  int local_8c;
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  stbtt_pack_range *local_70;
  stbrp_rect *local_68;
  ulong local_60;
  ulong local_58;
  stbtt_pack_range *local_50;
  stbtt_packedchar *local_48;
  int local_3c;
  int local_38;
  int local_34;
  
  uVar3 = spc->h_oversample;
  uVar4 = spc->v_oversample;
  if (num_ranges < 1) {
    local_bc = 1;
  }
  else {
    local_60 = (ulong)(uint)num_ranges;
    local_bc = 1;
    local_58 = 0;
    iVar14 = 0;
    local_70 = ranges;
    local_68 = rects;
    do {
      local_88 = ranges[local_58].font_size;
      uStack_84 = 0;
      uStack_80 = 0;
      uStack_7c = 0;
      if (local_88 <= 0.0) {
        uStack_84 = 0x80000000;
        uStack_80 = 0x80000000;
        uStack_7c = 0x80000000;
        local_88 = -local_88;
        uVar10 = (uint)(ushort)(*(ushort *)(info->data + (long)info->head + 0x12) << 8 |
                               *(ushort *)(info->data + (long)info->head + 0x12) >> 8);
      }
      else {
        puVar5 = info->data;
        lVar13 = (long)info->hhea;
        uVar10 = ((int)(short)((ushort)puVar5[lVar13 + 4] << 8) | (uint)puVar5[lVar13 + 5]) -
                 ((int)(short)((ushort)puVar5[lVar13 + 6] << 8) | (uint)puVar5[lVar13 + 7]);
      }
      local_88 = local_88 / (float)(int)uVar10;
      psVar12 = ranges + local_58;
      bVar1 = psVar12->h_oversample;
      spc->h_oversample = (uint)bVar1;
      bVar2 = psVar12->v_oversample;
      fVar16 = (float)bVar1;
      spc->v_oversample = (uint)bVar2;
      local_b4 = 0.0;
      local_b8 = 0.0;
      if (bVar1 != 0) {
        local_b8 = (float)(int)(1 - (uint)bVar1) / (fVar16 + fVar16);
      }
      fVar17 = (float)bVar2;
      if (bVar2 != 0) {
        local_b4 = (float)(int)(1 - (uint)bVar2) / (fVar17 + fVar17);
      }
      if (0 < psVar12->num_chars) {
        psVar9 = local_68 + iVar14;
        lVar13 = 0;
        lVar15 = 0;
        local_50 = psVar12;
        do {
          if (psVar9->was_packed == 0) {
            local_bc = 0;
          }
          else {
            if (psVar12->array_of_unicode_codepoints == (int *)0x0) {
              iVar11 = psVar12->first_unicode_codepoint_in_range + (int)lVar15;
            }
            else {
              iVar11 = psVar12->array_of_unicode_codepoints[lVar15];
            }
            local_48 = psVar12->chardata_for_range;
            iVar7 = stbtt_FindGlyphIndex(info,iVar11);
            iVar11 = spc->padding;
            psVar9->x = psVar9->x + iVar11;
            psVar9->y = psVar9->y + iVar11;
            psVar9->w = psVar9->w - iVar11;
            psVar9->h = psVar9->h - iVar11;
            stbtt_GetGlyphHMetrics(info,iVar7,&local_8c,&local_34);
            stbtt_GetGlyphBitmapBoxSubpixel
                      (info,iVar7,(float)spc->h_oversample * local_88,
                       (float)spc->v_oversample * local_88,0.0,0.0,&local_90,&local_94,&local_38,
                       &local_3c);
            stbtt_MakeGlyphBitmapSubpixel
                      (info,spc->pixels +
                            (long)psVar9->y * (long)spc->stride_in_bytes + (long)psVar9->x,
                       (psVar9->w - spc->h_oversample) + 1,(psVar9->h - spc->v_oversample) + 1,
                       spc->stride_in_bytes,(float)spc->h_oversample * local_88,
                       (float)spc->v_oversample * local_88,0.0,0.0,iVar7);
            if (1 < spc->h_oversample) {
              stbtt__h_prefilter(spc->pixels +
                                 (long)psVar9->y * (long)spc->stride_in_bytes + (long)psVar9->x,
                                 psVar9->w,psVar9->h,spc->stride_in_bytes,spc->h_oversample);
            }
            if (1 < spc->v_oversample) {
              stbtt__v_prefilter(spc->pixels +
                                 (long)psVar9->y * (long)spc->stride_in_bytes + (long)psVar9->x,
                                 psVar9->w,psVar9->h,spc->stride_in_bytes,spc->v_oversample);
            }
            sVar6 = (short)psVar9->x;
            *(short *)((long)&local_48->x0 + lVar13) = sVar6;
            sVar8 = (short)psVar9->y;
            *(short *)((long)&local_48->y0 + lVar13) = sVar8;
            iVar11 = psVar9->w;
            *(short *)((long)&local_48->x1 + lVar13) = sVar6 + (short)iVar11;
            iVar7 = psVar9->h;
            *(short *)((long)&local_48->y1 + lVar13) = sVar8 + (short)iVar7;
            *(float *)((long)&local_48->xadvance + lVar13) = (float)local_8c * local_88;
            *(float *)((long)&local_48->xoff + lVar13) = (float)local_90 * (1.0 / fVar16) + local_b8
            ;
            *(float *)((long)&local_48->yoff + lVar13) = (float)local_94 * (1.0 / fVar17) + local_b4
            ;
            *(float *)((long)&local_48->xoff2 + lVar13) =
                 (float)(local_90 + iVar11) * (1.0 / fVar16) + local_b8;
            *(float *)((long)&local_48->yoff2 + lVar13) =
                 (float)(local_94 + iVar7) * (1.0 / fVar17) + local_b4;
            psVar12 = local_50;
          }
          lVar15 = lVar15 + 1;
          psVar9 = psVar9 + 1;
          lVar13 = lVar13 + 0x1c;
        } while (lVar15 < psVar12->num_chars);
        iVar14 = iVar14 + (int)lVar15;
        ranges = local_70;
      }
      local_58 = local_58 + 1;
    } while (local_58 != local_60);
  }
  spc->h_oversample = uVar3;
  spc->v_oversample = uVar4;
  return local_bc;
}

Assistant:

STBTT_DEF int stbtt_PackFontRangesRenderIntoRects(stbtt_pack_context *spc, const stbtt_fontinfo *info, stbtt_pack_range *ranges, int num_ranges, stbrp_rect *rects)
{
   int i,j,k, return_value = 1;

   // save current values
   int old_h_over = spc->h_oversample;
   int old_v_over = spc->v_oversample;

   k = 0;
   for (i=0; i < num_ranges; ++i) {
      float fh = ranges[i].font_size;
      float scale = fh > 0 ? stbtt_ScaleForPixelHeight(info, fh) : stbtt_ScaleForMappingEmToPixels(info, -fh);
      float recip_h,recip_v,sub_x,sub_y;
      spc->h_oversample = ranges[i].h_oversample;
      spc->v_oversample = ranges[i].v_oversample;
      recip_h = 1.0f / spc->h_oversample;
      recip_v = 1.0f / spc->v_oversample;
      sub_x = stbtt__oversample_shift(spc->h_oversample);
      sub_y = stbtt__oversample_shift(spc->v_oversample);
      for (j=0; j < ranges[i].num_chars; ++j) {
         stbrp_rect *r = &rects[k];
         if (r->was_packed) {
            stbtt_packedchar *bc = &ranges[i].chardata_for_range[j];
            int advance, lsb, x0,y0,x1,y1;
            int codepoint = ranges[i].array_of_unicode_codepoints == NULL ? ranges[i].first_unicode_codepoint_in_range + j : ranges[i].array_of_unicode_codepoints[j];
            int glyph = stbtt_FindGlyphIndex(info, codepoint);
            stbrp_coord pad = (stbrp_coord) spc->padding;

            // pad on left and top
            r->x += pad;
            r->y += pad;
            r->w -= pad;
            r->h -= pad;
            stbtt_GetGlyphHMetrics(info, glyph, &advance, &lsb);
            stbtt_GetGlyphBitmapBox(info, glyph,
                                    scale * spc->h_oversample,
                                    scale * spc->v_oversample,
                                    &x0,&y0,&x1,&y1);
            stbtt_MakeGlyphBitmapSubpixel(info,
                                          spc->pixels + r->x + r->y*spc->stride_in_bytes,
                                          r->w - spc->h_oversample+1,
                                          r->h - spc->v_oversample+1,
                                          spc->stride_in_bytes,
                                          scale * spc->h_oversample,
                                          scale * spc->v_oversample,
                                          0,0,
                                          glyph);

            if (spc->h_oversample > 1)
               stbtt__h_prefilter(spc->pixels + r->x + r->y*spc->stride_in_bytes,
                                  r->w, r->h, spc->stride_in_bytes,
                                  spc->h_oversample);

            if (spc->v_oversample > 1)
               stbtt__v_prefilter(spc->pixels + r->x + r->y*spc->stride_in_bytes,
                                  r->w, r->h, spc->stride_in_bytes,
                                  spc->v_oversample);

            bc->x0       = (stbtt_int16)  r->x;
            bc->y0       = (stbtt_int16)  r->y;
            bc->x1       = (stbtt_int16) (r->x + r->w);
            bc->y1       = (stbtt_int16) (r->y + r->h);
            bc->xadvance =                scale * advance;
            bc->xoff     =       (float)  x0 * recip_h + sub_x;
            bc->yoff     =       (float)  y0 * recip_v + sub_y;
            bc->xoff2    =                (x0 + r->w) * recip_h + sub_x;
            bc->yoff2    =                (y0 + r->h) * recip_v + sub_y;
         } else {
            return_value = 0; // if any fail, report failure
         }

         ++k;
      }
   }

   // restore original values
   spc->h_oversample = old_h_over;
   spc->v_oversample = old_v_over;

   return return_value;
}